

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::readArrayBasedContainer<QList<QString>>(QDataStream *s,QList<QString> *c)

{
  long lVar1;
  Status SVar2;
  qint64 qVar3;
  QString *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type t;
  StreamStateSaver stateSaver;
  QDataStream *in_stack_ffffffffffffff58;
  QDataStream *in_stack_ffffffffffffff60;
  long local_80;
  QList<QString> *in_stack_ffffffffffffffa8;
  QDataStream *local_40;
  undefined1 *asize;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  asize = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver
            ((StreamStateSaver *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  QList<QString>::clear((QList<QString> *)in_stack_ffffffffffffff60);
  qVar3 = QDataStream::readQSizeType(in_stack_ffffffffffffff60);
  if (qVar3 < 0) {
    QDataStream::setStatus(in_RDI,SizeLimitExceeded);
    local_40 = in_RDI;
  }
  else {
    QList<QString>::reserve(in_stack_ffffffffffffffa8,(qsizetype)asize);
    for (local_80 = 0; local_40 = in_RDI, local_80 < qVar3; local_80 = local_80 + 1) {
      QString::QString((QString *)0x3e3902);
      ::operator>>(in_RDI,in_RSI);
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 == Ok) {
        QList<QString>::append
                  ((QList<QString> *)in_stack_ffffffffffffff60,
                   (parameter_type)in_stack_ffffffffffffff58);
      }
      else {
        QList<QString>::clear((QList<QString> *)in_stack_ffffffffffffff60);
      }
      QString::~QString((QString *)0x3e3986);
      local_40 = in_RDI;
      if (SVar2 != Ok) break;
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}